

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O3

void __thiscall PrintC::pushAnnotation(PrintC *this,Varnode *vn,PcodeOp *op)

{
  int iVar1;
  ScopeLocal *this_00;
  pointer ppVVar2;
  Architecture *pAVar3;
  Translate *pTVar4;
  Varnode *pVVar5;
  SymbolEntry *pSVar6;
  Datatype *pDVar7;
  uint size;
  string regname;
  string local_70;
  Atom local_50;
  
  this_00 = op->parent->data->localmap;
  if (op->opcode->opcode == CPUI_CALLOTHER) {
    ppVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar1 = (int)((*ppVVar2)->loc).offset;
    pAVar3 = (this->super_PrintLanguage).glb;
    if ((((pAVar3->userops).vol_write)->super_VolatileOp).super_UserPcodeOp.useropindex == iVar1) {
      pVVar5 = ppVVar2[2];
LAB_00303d10:
      size = pVVar5->size;
      if (size == 0) goto LAB_00303d58;
    }
    else {
      if ((((pAVar3->userops).vol_read)->super_VolatileOp).super_UserPcodeOp.useropindex != iVar1)
      goto LAB_00303d58;
      pVVar5 = op->output;
      if (pVVar5 != (Varnode *)0x0) goto LAB_00303d10;
      size = 1;
    }
    pSVar6 = Scope::queryContainer((Scope *)this_00,&vn->loc,size,&(op->start).pc);
    if (pSVar6 != (SymbolEntry *)0x0) {
      if (pSVar6->size != size) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[7])
                  (this,pSVar6->symbol,
                   (ulong)(uint)((int)(vn->loc).offset - (int)(pSVar6->addr).offset),(ulong)size,vn,
                   op,0);
        return;
      }
LAB_00303d6f:
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[5])(this,pSVar6->symbol,vn,op);
      return;
    }
  }
  else {
LAB_00303d58:
    pSVar6 = Scope::queryContainer((Scope *)this_00,&vn->loc,1,&(op->start).pc);
    if (pSVar6 != (SymbolEntry *)0x0) goto LAB_00303d6f;
    size = vn->size;
  }
  pTVar4 = ((this->super_PrintLanguage).glb)->translate;
  (*(pTVar4->super_AddrSpaceManager)._vptr_AddrSpaceManager[8])
            (&local_70,pTVar4,(vn->loc).base,(vn->loc).offset,(ulong)size);
  if (local_70._M_string_length == 0) {
    pDVar7 = TypeFactory::getBase(((this->super_PrintLanguage).glb)->types,size,TYPE_UINT);
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[2])
              (this,(vn->loc).offset / (ulong)((vn->loc).base)->wordsize,pDVar7,vn,op);
  }
  else {
    local_50.type = vartoken;
    local_50.highlight = var_color;
    local_50.name = &local_70;
    local_50.op = op;
    local_50.ptr_second.vn = vn;
    PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PrintC::pushAnnotation(const Varnode *vn,const PcodeOp *op)

{
  const Scope *scope = op->getParent()->getFuncdata()->getScopeLocal();
  int4 size = 0;
  if (op->code() == CPUI_CALLOTHER) {
  // This construction is for volatile CALLOTHERs where the input annotation is the original address
  // of the volatile access
    int4 userind = (int4)op->getIn(0)->getOffset();
    VolatileWriteOp *vw_op = glb->userops.getVolatileWrite();
    VolatileReadOp *vr_op = glb->userops.getVolatileRead();
    if (userind == vw_op->getIndex()) {	// Annotation from a volatile write
      size = op->getIn(2)->getSize(); // Get size from the 3rd parameter of write function
    }
    else if (userind == vr_op->getIndex()) {
      const Varnode *outvn = op->getOut();
      if (outvn != (const Varnode *)0)
	size = op->getOut()->getSize(); // Get size from output of read function
      else
	size = 1;
    }
  }
  SymbolEntry *entry;
  if (size != 0)
    entry = scope->queryContainer(vn->getAddr(),size,op->getAddr());
  else {
    entry = scope->queryContainer(vn->getAddr(),1,op->getAddr());
    if (entry != (SymbolEntry *)0)
      size = entry->getSize();
    else
      size = vn->getSize();
  }
  
  if (entry != (SymbolEntry *)0) {
    if (entry->getSize() == size)
      pushSymbol(entry->getSymbol(),vn,op);
    else {
      int4 symboloff = vn->getOffset() - entry->getFirst();
      pushPartialSymbol(entry->getSymbol(),symboloff,size,vn,op,(Datatype *)0);
    }
  }
  else {
    string regname = glb->translate->getRegisterName(vn->getSpace(),vn->getOffset(),size);
    if (regname.empty()) {
      Datatype *ct = glb->types->getBase(size,TYPE_UINT);
      pushConstant(AddrSpace::byteToAddress(vn->getOffset(),vn->getSpace()->getWordSize()),ct,vn,op);
    }
    else
      pushAtom(Atom(regname,vartoken,EmitXml::var_color,op,vn));
  }
}